

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_subroutine(Parser *this)

{
  string *__k;
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Tokenizer *pTVar2;
  VM_Writer *pVVar3;
  pointer pcVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  const_iterator cVar8;
  size_type *psVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  string name;
  string return_type;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  poVar7 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t<subroutine>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  poVar7 = (ostream *)this->out_file;
  __rhs = &this->cur_subroutine_type;
  std::operator+(&local_90,"\t\t<keyword>",__rhs);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  paVar1 = &local_b0.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0.field_2._8_8_ = plVar6[3];
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_b0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar5 == 0) {
    Tokenizer::get_current_token_abi_cxx11_(&local_b0,this->tokenizer);
    bVar12 = true;
    if (local_b0._M_string_length == (this->class_name)._M_string_length) {
      if (local_b0._M_string_length == 0) {
        bVar12 = false;
      }
      else {
        iVar5 = bcmp(local_b0._M_dataplus._M_p,(this->class_name)._M_dataplus._M_p,
                     local_b0._M_string_length);
        bVar12 = iVar5 != 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar12) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Invalid constructor identifier",0x1e);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      exit(0);
    }
    query_tokenizer(this);
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"new","");
    check_expected_x_after_y(this,&local_b0,&this->class_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    poVar7 = (ostream *)this->out_file;
    std::operator+(&local_90,"\t\t<keyword>",&this->cur_token);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
LAB_0012a2bf:
    query_tokenizer(this);
  }
  else {
    pTVar2 = this->tokenizer;
    __k = &this->cur_token;
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(pTVar2->type_map)._M_t,__k);
    if (((_Rb_tree_header *)cVar8._M_node != &(pTVar2->type_map)._M_t._M_impl.super__Rb_tree_header)
       || (iVar5 = std::__cxx11::string::compare((char *)__k), iVar5 == 0)) {
      std::__cxx11::string::_M_assign((string *)&local_50);
      poVar7 = (ostream *)this->out_file;
      std::operator+(&local_90,"\t\t<keyword>",__k);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0.field_2._8_8_ = plVar6[3];
        local_b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      query_tokenizer(this);
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"IDENTIFIER","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"subroutine definition","");
      check_token_type_x_after_y(this,&local_b0,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      poVar7 = (ostream *)this->out_file;
      std::operator+(&local_90,"\t\t<identifier>",__k);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0.field_2._8_8_ = plVar6[3];
        local_b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&local_70);
      goto LAB_0012a2bf;
    }
    std::operator+(&local_90,"Compiler Error: \'",__k);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"(","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"identifier","");
  check_expected_x_after_y(this,&local_b0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  poVar7 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t<symbol>(</symbol>",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  query_tokenizer(this);
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar5 == 0) {
    parse_param_list(this);
    pVVar3 = this->vm_writer;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar4 = (this->class_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar4,pcVar4 + (this->class_name)._M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    iVar5 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
    VM_Writer::write_function(pVVar3,&local_b0,iVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    uVar10 = local_90.field_2._M_allocated_capacity;
    _Var11._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0012a782;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar5 == 0) {
      parse_param_list(this);
      iVar5 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      pVVar3 = this->vm_writer;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar4 = (this->class_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,pcVar4 + (this->class_name)._M_string_length);
      std::__cxx11::string::append((char *)&local_90);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0.field_2._8_8_ = plVar6[3];
        local_b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      VM_Writer::write_function(pVVar3,&local_b0,iVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"function","");
      Symbol_Table::set_function_data(&this->symbol_table,&local_70,&local_b0,iVar5);
    }
    else {
      parse_param_list(this);
      iVar5 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"method","");
      Symbol_Table::set_function_data(&this->symbol_table,&local_70,&local_b0,iVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pVVar3 = this->vm_writer;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar4 = (this->class_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,pcVar4 + (this->class_name)._M_string_length);
      std::__cxx11::string::append((char *)&local_90);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0.field_2._8_8_ = plVar6[3];
        local_b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      VM_Writer::write_function(pVVar3,&local_b0,iVar5 + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pVVar3 = this->vm_writer;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"argument","");
      VM_Writer::write_push(pVVar3,&local_b0,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pVVar3 = this->vm_writer;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"this","");
      VM_Writer::write_pop(pVVar3,&local_b0,0);
    }
    uVar10 = local_b0.field_2._M_allocated_capacity;
    _Var11._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar1) goto LAB_0012a782;
  }
  operator_delete(_Var11._M_p,uVar10 + 1);
LAB_0012a782:
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,")","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"parameter list","");
  check_expected_x_after_y(this,&local_b0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  poVar7 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t<symbol>)</symbol>",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  query_tokenizer(this);
  parse_subroutine_body(this);
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_50), iVar5 == 0)) {
    pVVar3 = this->vm_writer;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"constant","");
    VM_Writer::write_push(pVVar3,&local_b0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  VM_Writer::write_return(this->vm_writer);
  poVar7 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t</subroutine>",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  Symbol_Table::start_subroutine(&this->symbol_table);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Parser::parse_subroutine() {
    out_file << "\t<subroutine>" << std::endl;

    std::string name, return_type;
    out_file << "\t\t<keyword>" + cur_subroutine_type + "</keyword>" << std::endl;

    if (cur_subroutine_type == "constructor") {
        if (tokenizer.get_current_token() != class_name) {
            std::cerr << "Invalid constructor identifier" << std::endl;
            exit(0);
        }

        query_tokenizer();

        check_expected_x_after_y("new", class_name);
        out_file << "\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        query_tokenizer();
    }

    else if (tokenizer.type_exists(cur_token) || cur_token == "void") {
        return_type = cur_token;
        out_file << "\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", "subroutine definition");
        out_file << "\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        name = cur_token;
        query_tokenizer();
    }
    else {
        std::cerr << "Compiler Error: '" + cur_token + "' not a valid type for a subroutine"
        << std::endl;
    }
    check_expected_x_after_y("(", "identifier");
    out_file << "\t\t<symbol>(</symbol>" << std::endl;
    query_tokenizer();

    if (cur_subroutine_type == "constructor") {
        parse_param_list();
        vm_writer.write_function(class_name+"."+name, symbol_table.get_temp_arg_count());
    }
    else if (cur_subroutine_type == "function") {
        parse_param_list();
        int n_args = symbol_table.get_temp_arg_count();
        vm_writer.write_function(class_name + "." + name, n_args);
        symbol_table.set_function_data(name, "function", n_args);

    }
    else {
        parse_param_list();
        int n_args = symbol_table.get_temp_arg_count();
        symbol_table.set_function_data(name, "method", n_args);
        vm_writer.write_function(class_name + "." + name, n_args + 1);
        vm_writer.write_push("argument", 0);
        vm_writer.write_pop("this", 0);

    }


    check_expected_x_after_y(")", "parameter list");
    out_file << "\t\t<symbol>)</symbol>" << std::endl;

    query_tokenizer();
    parse_subroutine_body();

    // functions and void return type methods are specified to return 0;
    if (cur_subroutine_type == "function" || return_type == "void") {
        vm_writer.write_push("constant", 0);
    }
    vm_writer.write_return();
    out_file << "\t</subroutine>" << std::endl;
    symbol_table.start_subroutine();
}